

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_free.c
# Opt level: O2

void lyd_free_leafref_nodes(lyd_node_term *node)

{
  lysc_node *plVar1;
  ly_ht *ht;
  LY_ERR LVar2;
  uint32_t hash;
  lys_module *plVar3;
  lyd_leafref_links_rec *rec;
  lyd_node_term *node_local;
  
  node_local = node;
  if (node != (lyd_node_term *)0x0) {
    LVar2 = lyd_get_or_create_leafref_links_record(node,&rec,'\0');
    if (LVar2 == LY_SUCCESS) {
      lyd_free_leafref_links_rec(rec);
      plVar1 = (node->field_0).node.schema;
      if (plVar1 == (lysc_node *)0x0) {
        plVar3 = (lys_module *)&node[1].field_0.node.next;
      }
      else {
        plVar3 = plVar1->module;
      }
      ht = plVar3->ctx->leafref_links_ht;
      hash = lyht_hash((char *)&node_local,8);
      lyht_remove(ht,rec,hash);
    }
    return;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_free.c"
                ,0xb6,"void lyd_free_leafref_nodes(const struct lyd_node_term *)");
}

Assistant:

void
lyd_free_leafref_nodes(const struct lyd_node_term *node)
{
    struct ly_ht *ht;
    uint32_t hash;
    struct lyd_leafref_links_rec *rec;

    assert(node);

    if (lyd_get_or_create_leafref_links_record(node, &rec, 0)) {
        return;
    }

    /* free entry content */
    lyd_free_leafref_links_rec(rec);

    /* free entry itself from hash table */
    ht = LYD_CTX(node)->leafref_links_ht;
    hash = lyht_hash((const char *)&node, sizeof node);
    lyht_remove(ht, rec, hash);
}